

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O2

void calc_sad4_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int cand_start,int *cost_list)

{
  buf_2d *pbVar1;
  buf_2d *pbVar2;
  search_site_config *psVar3;
  uint8_t *puVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint *puVar9;
  FULLPEL_MV this_mv;
  uint sads_buf [4];
  uchar *block_offset [4];
  FULLPEL_MV local_84;
  MV_COST_PARAMS *local_80;
  FULLPEL_MV *local_78;
  uint *local_70;
  uint local_68 [4];
  uint8_t *local_58 [5];
  
  lVar6 = (long)search_step;
  pbVar1 = (ms_params->ms_buffers).ref;
  pbVar2 = (ms_params->ms_buffers).src;
  psVar3 = ms_params->search_sites;
  lVar7 = (long)cand_start;
  puVar4 = pbVar2->buf;
  iVar5 = pbVar2->stride;
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    local_58[lVar8] = center_address + psVar3->site[lVar6][lVar7 + lVar8].offset;
  }
  puVar9 = (uint *)(cost_list + 1);
  if (cost_list == (int *)0x0) {
    puVar9 = local_68;
  }
  local_80 = mv_cost_params;
  local_78 = best_mv;
  local_70 = bestsad;
  (*ms_params->sdx4df)(puVar4,iVar5,local_58,pbVar1->stride,puVar9);
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    local_84.row = psVar3->site[lVar6][lVar7 + lVar8].mv.row + center_mv.row;
    local_84.col = psVar3->site[lVar6][lVar7 + lVar8].mv.col + center_mv.col;
    iVar5 = update_mvs_and_sad(puVar9[lVar8],&local_84,local_80,local_70,raw_bestsad,local_78,
                               (FULLPEL_MV *)0x0);
    if (iVar5 != 0) {
      *best_site = cand_start + (int)lVar8;
    }
  }
  return;
}

Assistant:

static inline void calc_sad4_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    const FULLPEL_MV center_mv, const uint8_t *center_address,
    unsigned int *bestsad, unsigned int *raw_bestsad, int search_step,
    int *best_site, int cand_start, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];

  unsigned char const *block_offset[4];
  unsigned int sads_buf[4];
  unsigned int *sads;
  const uint8_t *src_buf = src->buf;
  const int src_stride = src->stride;
  if (cost_list) {
    sads = (unsigned int *)(cost_list + 1);
  } else {
    sads = sads_buf;
  }
  // Loop over number of candidates.
  for (int j = 0; j < 4; j++)
    block_offset[j] = site[cand_start + j].offset + center_address;

  // 4-point sad calculation.
  ms_params->sdx4df(src_buf, src_stride, block_offset, ref->stride, sads);

  for (int j = 0; j < 4; j++) {
    const FULLPEL_MV this_mv = { center_mv.row + site[cand_start + j].mv.row,
                                 center_mv.col + site[cand_start + j].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = cand_start + j;
  }
}